

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location)

{
  bool bVar1;
  bool bVar2;
  FieldOptions *options;
  LocationRecorder location;
  
  bVar1 = LookingAt(this,"[");
  bVar2 = true;
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,field_location,8);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        bVar1 = LookingAt(this,"default");
        if (bVar1) {
          bVar1 = ParseDefaultAssignment(this,field,field_location);
        }
        else {
          options = FieldDescriptorProto::mutable_options(field);
          bVar1 = ParseOption(this,&options->super_Message,&location,OPTION_ASSIGNMENT);
        }
        if (bVar1 == false) goto LAB_00218e89;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar2 = Consume(this,"]");
    }
    else {
LAB_00218e89:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location));
    } else {
      DO(ParseOption(field->mutable_options(), location, OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}